

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiger.cpp
# Opt level: O0

void __thiscall despot::Tiger::PrintAction(Tiger *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  ACT_TYPE action_local;
  Tiger *this_local;
  
  if (action == 0) {
    poVar1 = std::operator<<(out,"Open left");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (action == 1) {
    poVar1 = std::operator<<(out,"Open right");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<(out,"Listen");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Tiger::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		out << "Open left" << endl;
	} else if (action == RIGHT) {
		out << "Open right" << endl;
	} else {
		out << "Listen" << endl;
	}
}